

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::
vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>::
reserve(vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
        *this,size_t n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  memory_resource *pmVar3;
  undefined8 uVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar7;
  ulong uVar8;
  RGBUnboundedSpectrum *pRVar6;
  
  if (this->nAlloc < n) {
    if (n << 4 == 0) {
      pRVar6 = (RGBUnboundedSpectrum *)0x0;
    }
    else {
      pmVar3 = (this->alloc).memoryResource;
      iVar5 = (*pmVar3->_vptr_memory_resource[2])(pmVar3,n << 4,4);
      pRVar6 = (RGBUnboundedSpectrum *)CONCAT44(extraout_var,iVar5);
    }
    if (this->nStored != 0) {
      lVar7 = 0;
      uVar8 = 0;
      do {
        puVar1 = (undefined8 *)((long)&this->ptr->scale + lVar7);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pRVar6->scale + lVar7);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x10;
      } while (uVar8 < this->nStored);
    }
    if (this->ptr != (RGBUnboundedSpectrum *)0x0) {
      pmVar3 = (this->alloc).memoryResource;
      (*pmVar3->_vptr_memory_resource[3])(pmVar3,this->ptr,this->nAlloc << 4,4);
    }
    this->nAlloc = n;
    this->ptr = pRVar6;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }